

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall
ON_Matrix::BackSolve
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int Bsize,int Bpt_stride,double *Bpt,
          int Xpt_stride,double *Xpt)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double **ppdVar4;
  bool bVar5;
  double ***pppdVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  
  uVar10 = (ulong)(uint)pt_dim;
  iVar2 = this->m_col_count;
  lVar11 = (long)iVar2;
  iVar3 = this->m_row_count;
  if (iVar3 < iVar2) {
LAB_0050b40a:
    bVar5 = false;
  }
  else {
    bVar5 = false;
    if (Bsize <= iVar3 && iVar2 <= Bsize) {
      if (pt_dim < 1) {
        uVar10 = 0;
      }
      lVar13 = (long)Bpt_stride;
      pdVar9 = Bpt + lVar11 * lVar13;
      for (lVar14 = lVar11; lVar14 != Bsize; lVar14 = lVar14 + 1) {
        uVar15 = 0;
        while (uVar10 != uVar15) {
          pdVar12 = pdVar9 + uVar15;
          uVar15 = uVar15 + 1;
          if (zero_tolerance < ABS(*pdVar12)) goto LAB_0050b40a;
        }
        pdVar9 = pdVar9 + lVar13;
      }
      pppdVar6 = &this->m;
      if (iVar3 == (this->m_rowmem).m_count) {
        pppdVar6 = &(this->m_rowmem).m_a;
      }
      ppdVar4 = *pppdVar6;
      if (Xpt == Bpt) {
        lVar14 = (long)(iVar2 + -2);
        lVar13 = (long)Xpt_stride;
        pdVar9 = Xpt + lVar13 * lVar14;
        pdVar12 = Xpt + (lVar14 + 1) * lVar13;
        for (; pdVar7 = pdVar12, lVar8 = lVar14, -1 < lVar14; lVar14 = lVar14 + -1) {
          while (lVar8 = lVar8 + 1, lVar8 < lVar11) {
            dVar1 = ppdVar4[lVar14][lVar8];
            for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
              pdVar9[uVar15] = pdVar7[uVar15] * -dVar1 + pdVar9[uVar15];
            }
            pdVar7 = pdVar7 + lVar13;
          }
          pdVar9 = pdVar9 + -lVar13;
          pdVar12 = pdVar12 + -lVar13;
        }
      }
      else {
        memcpy(Xpt + (iVar2 + -1) * Xpt_stride,Bpt + (iVar2 + -1) * Bpt_stride,(long)(pt_dim * 8));
        lVar14 = (long)(this->m_col_count + -2);
        lVar11 = (long)Xpt_stride;
        pdVar9 = Xpt + lVar11 * lVar14;
        pdVar12 = Xpt + (lVar14 + 1) * lVar11;
        for (; -1 < lVar14; lVar14 = lVar14 + -1) {
          memcpy(Xpt + lVar14 * lVar11,Bpt + lVar14 * lVar13,(long)(pt_dim * 8));
          iVar2 = this->m_col_count;
          pdVar7 = pdVar12;
          lVar8 = lVar14;
          while (lVar8 = lVar8 + 1, lVar8 < iVar2) {
            dVar1 = ppdVar4[lVar14][lVar8];
            for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
              pdVar9[uVar15] = pdVar7[uVar15] * -dVar1 + pdVar9[uVar15];
            }
            pdVar7 = pdVar7 + lVar11;
          }
          pdVar9 = pdVar9 + -lVar11;
          pdVar12 = pdVar12 + -lVar11;
        }
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int pt_dim,
    int Bsize,
    int Bpt_stride,
    const double* Bpt,
    int Xpt_stride,
    double* Xpt
    ) const
{
  const int sizeof_pt = pt_dim*sizeof(double);
  double mij;
  int i, j, k;
  const double* Bi;
  double* Xi;
  double* Xj;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) 
  {
    Bi = Bpt + i*Bpt_stride;
    for( j = 0; j < pt_dim; j++ )
    {
      if ( fabs(Bi[j]) > zero_tolerance )
        return false; // over determined
    }
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( Xpt != Bpt )
  {
    Xi = Xpt + (m_col_count-1)*Xpt_stride;
    Bi = Bpt + (m_col_count-1)*Bpt_stride;
    memcpy(Xi,Bi,sizeof_pt);
    for ( i = m_col_count-2; i >= 0; i-- ) {
      Xi = Xpt + i*Xpt_stride;
      Bi = Bpt + i*Bpt_stride;
      memcpy(Xi,Bi,sizeof_pt);
      for ( j = i+1; j < m_col_count; j++ ) {
        Xj = Xpt + j*Xpt_stride;
        mij = this_m[i][j];
        for ( k = 0; k < pt_dim; k++ )
          Xi[k] -= mij*Xj[k];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      Xi = Xpt + i*Xpt_stride;
      for ( j = i+1; j < m_col_count; j++ ) {
        Xj = Xpt + j*Xpt_stride;
        mij = this_m[i][j];
        for ( k = 0; k < pt_dim; k++ )
          Xi[k] -= mij*Xj[k];
      }
    }
  }

  return true;
}